

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_threeExpectedAndActual_Test::testBody
          (TEST_MockCallTest_threeExpectedAndActual_Test *this)

{
  MockSupport *pMVar1;
  SimpleString SStack_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"function1");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"function2");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"function3");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"function1");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"function2");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"function3");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])(pMVar1);
  SimpleString::~SimpleString(&local_18);
  return;
}

Assistant:

TEST(MockCallTest, threeExpectedAndActual)
{
    mock().expectOneCall("function1");
    mock().expectOneCall("function2");
    mock().expectOneCall("function3");
    mock().actualCall("function1");
    mock().actualCall("function2");
    mock().actualCall("function3");

    mock().checkExpectations();
}